

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_set_xquad(secp256k1_ge *r,secp256k1_fe *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  secp256k1_fe x3;
  secp256k1_fe x2;
  secp256k1_fe local_70;
  secp256k1_fe local_48;
  
  (r->x).n[4] = x->n[4];
  uVar1 = x->n[0];
  uVar2 = x->n[1];
  uVar3 = x->n[3];
  (r->x).n[2] = x->n[2];
  (r->x).n[3] = uVar3;
  (r->x).n[0] = uVar1;
  (r->x).n[1] = uVar2;
  secp256k1_fe_sqr(&local_48,x);
  secp256k1_fe_mul(&local_70,x,&local_48);
  r->infinity = 0;
  secp256k1_fe_add(&local_70,&secp256k1_fe_const_b);
  iVar4 = secp256k1_fe_sqrt(&r->y,&local_70);
  return iVar4;
}

Assistant:

static int secp256k1_ge_set_xquad(secp256k1_ge *r, const secp256k1_fe *x) {
    secp256k1_fe x2, x3;
    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add(&x3, &secp256k1_fe_const_b);
    return secp256k1_fe_sqrt(&r->y, &x3);
}